

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

char * Scl_LibertyReadCellArea(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  char *pcVar2;
  Scl_Item_t *local_28;
  Scl_Item_t *pArea;
  Scl_Item_t *pCell_local;
  Scl_Tree_t *p_local;
  
  local_28 = Scl_LibertyItem(p,pCell->Child);
  while( true ) {
    if (local_28 == (Scl_Item_t *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Scl_LibertyCompare(p,local_28->Key,"area");
    if (iVar1 == 0) break;
    local_28 = Scl_LibertyItem(p,local_28->Next);
  }
  pcVar2 = Scl_LibertyReadString(p,local_28->Head);
  return pcVar2;
}

Assistant:

char * Scl_LibertyReadCellArea( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pArea;
    Scl_ItemForEachChildName( p, pCell, pArea, "area" )
        return Scl_LibertyReadString(p, pArea->Head);
    return 0;
}